

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pace.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Config config_00;
  Config config_01;
  Config config_02;
  Config config_03;
  Config config_04;
  Config config_05;
  Config config_06;
  Config config_07;
  int iVar1;
  int iVar2;
  void *__buf;
  size_t __n;
  ssize_t sVar3;
  result_type rVar4;
  long in_RSI;
  int in_EDI;
  int i_1;
  Config config_2;
  Config config_1;
  Config config;
  minstd_rand rand_gen;
  int node_count;
  string msg_1;
  ListGraph g;
  char msg [865];
  int i;
  string input_file_name;
  int random_seed;
  string *in_stack_ffffffffffffea68;
  ArrayIDIDFunc *pAVar5;
  ListGraph *in_stack_ffffffffffffea70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffea78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  undefined4 in_stack_ffffffffffffea8c;
  PierceRating in_stack_ffffffffffffea90;
  undefined4 uStack_156c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeaa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeaa8;
  undefined8 in_stack_ffffffffffffeab8;
  allocator *paVar8;
  allocator *in_stack_ffffffffffffeb20;
  ComputeSeparator *in_stack_ffffffffffffeb28;
  ArrayIDIDFunc *in_stack_ffffffffffffeb30;
  ArrayIDIDFunc *head;
  ArrayIDIDFunc *in_stack_ffffffffffffeb38;
  ArrayIDIDFunc *tail;
  string *in_stack_ffffffffffffebb0;
  code *this;
  ArrayIDIDFunc *in_stack_ffffffffffffebf0;
  ArrayIDIDFunc *in_stack_ffffffffffffebf8;
  allocator<char> local_1399;
  string local_1398 [32];
  string local_1378 [39];
  allocator local_1351;
  string local_1350 [32];
  string local_1330 [39];
  undefined1 local_1309 [33];
  string local_12e8 [32];
  string local_12c8 [32];
  string local_12a8 [32];
  string local_1288 [32];
  string local_1268 [32];
  ArrayIDIDFunc *in_stack_ffffffffffffedb8;
  string *in_stack_ffffffffffffedc0;
  allocator local_1189;
  string local_1188 [32];
  string local_1168 [39];
  allocator local_1141;
  string local_1140 [32];
  string local_1120 [39];
  allocator local_10f9;
  string local_10f8 [32];
  string local_10d8 [32];
  string local_10b8 [32];
  string local_1098 [32];
  string local_1078 [32];
  string local_1058 [32];
  string local_1038 [32];
  ArrayIDIDFunc *local_1018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1008;
  GraphSearchAlgorithm GStack_1000;
  AvoidAugmentingPath AStack_ffc;
  PierceRating local_ff8;
  allocator local_f79;
  string local_f78 [32];
  string local_f58 [39];
  allocator local_f31;
  string local_f30 [32];
  string local_f10 [39];
  allocator local_ee9;
  string local_ee8 [32];
  string local_ec8 [32];
  string local_ea8 [32];
  string local_e88 [32];
  string local_e68 [32];
  string local_e48 [32];
  string local_e28 [32];
  ArrayIDIDFunc *local_e08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_e00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_df8;
  GraphSearchAlgorithm GStack_df0;
  AvoidAugmentingPath AStack_dec;
  PierceRating local_de8;
  allocator local_d69;
  string local_d68 [32];
  string local_d48 [39];
  allocator local_d21;
  string local_d20 [32];
  string local_d00 [39];
  allocator local_cd9;
  string local_cd8 [32];
  string local_cb8 [32];
  string local_c98 [32];
  string local_c78 [32];
  string local_c58 [32];
  string local_c38 [32];
  string local_c18 [32];
  ArrayIDIDFunc *local_bf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_bf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_be8;
  GraphSearchAlgorithm GStack_be0;
  AvoidAugmentingPath AStack_bdc;
  PierceRating local_bd8;
  allocator local_b59;
  string local_b58 [32];
  string local_b38 [39];
  allocator local_b11;
  string local_b10 [32];
  string local_af0 [39];
  allocator local_ac9;
  string local_ac8 [32];
  string local_aa8 [32];
  string local_a88 [32];
  string local_a68 [32];
  string local_a48 [32];
  string local_a28 [32];
  string local_a08 [32];
  ArrayIDIDFunc *local_9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_9d8;
  GraphSearchAlgorithm GStack_9d0;
  AvoidAugmentingPath AStack_9cc;
  PierceRating local_9c8;
  undefined1 local_951 [33];
  string local_930 [39];
  undefined1 local_909 [33];
  string local_8e8 [39];
  allocator local_8c1;
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  int local_7e0;
  undefined1 local_7dc [32];
  PierceRating local_7bc;
  ArrayIDIDFunc *local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_7a8;
  GraphSearchAlgorithm GStack_7a0;
  AvoidAugmentingPath AStack_79c;
  PierceRating local_798;
  allocator local_721;
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [36];
  undefined1 local_6bc [32];
  PierceRating local_69c;
  ArrayIDIDFunc *local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_690;
  char *pcStack_688;
  GraphSearchAlgorithm GStack_680;
  AvoidAugmentingPath AStack_67c;
  PierceRating local_678;
  allocator local_601;
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [36];
  undefined1 local_59c [32];
  PierceRating local_57c;
  undefined1 *local_578;
  allocator local_521;
  string local_520 [63];
  allocator local_4e1;
  string local_4e0 [32];
  undefined1 local_4c0 [12];
  int local_4b4;
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [84];
  int local_3bc;
  undefined1 local_3b8 [872];
  int local_50;
  allocator local_39;
  string local_38 [36];
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  this = signal_handler;
  local_10 = in_RSI;
  local_8 = in_EDI;
  signal(0xf,signal_handler);
  signal(2,this);
  signal(0xb,this);
  local_14 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"-",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_50 = 1;
  do {
    iVar2 = (int)((ulong)in_stack_ffffffffffffeab8 >> 0x20);
    if (local_8 <= local_50) {
      uncached_load_pace_graph(in_stack_ffffffffffffea68);
      ArrayIDIDFunc::operator=
                (&in_stack_ffffffffffffea70->head,(ArrayIDIDFunc *)in_stack_ffffffffffffea68);
      ArrayIDIDFunc::operator=
                (&in_stack_ffffffffffffea70->head,(ArrayIDIDFunc *)in_stack_ffffffffffffea68);
      ListGraph::~ListGraph(in_stack_ffffffffffffea70);
      local_3bc = 0;
LAB_0014deec:
      std::__cxx11::string::~string(local_38);
      if (local_3bc == 0) {
        if ((print_status & 1U) != 0) {
          ArrayIDIDFunc::image_count(&::tail);
          std::__cxx11::to_string(iVar2);
          std::operator+((char *)in_stack_ffffffffffffea78,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffea70);
          std::operator+(in_stack_ffffffffffffea78,(char *)in_stack_ffffffffffffea70);
          ArrayIDFunc<int>::preimage_count(&::tail.super_ArrayIDFunc<int>);
          std::__cxx11::to_string(iVar2);
          std::operator+(in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
          std::operator+(in_stack_ffffffffffffea78,(char *)in_stack_ffffffffffffea70);
          std::__cxx11::string::~string(local_430);
          std::__cxx11::string::~string(local_4b0);
          std::__cxx11::string::~string(local_450);
          std::__cxx11::string::~string(local_470);
          std::__cxx11::string::~string(local_490);
          __buf = (void *)std::__cxx11::string::data();
          __n = std::__cxx11::string::length();
          sVar3 = write(2,__buf,__n);
          ignore_return_value((int)sVar3);
          std::__cxx11::string::~string(local_410);
        }
        if ((print_status & 1U) != 0) {
          program_start_milli_time = get_milli_time();
        }
        local_4b4 = ArrayIDIDFunc::image_count(&::tail);
        std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
        linear_congruential_engine
                  ((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)0x14e1cb
                  );
        std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::seed
                  ((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
                   in_stack_ffffffffffffea70,(result_type)in_stack_ffffffffffffea68);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4e0,"greedy order",&local_4e1);
        compute_greedy_order(in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
        test_new_elimination_order(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
        ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14e258);
        std::__cxx11::string::~string(local_4e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
        if (local_4b4 < best_tree_depth * 0x14) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_520,"refined bfs split in nested dissection",&local_521);
          ArrayIDIDFunc::ArrayIDIDFunc
                    (&in_stack_ffffffffffffea70->head,(ArrayIDIDFunc *)in_stack_ffffffffffffea68);
          ArrayIDIDFunc::ArrayIDIDFunc
                    (&in_stack_ffffffffffffea70->head,(ArrayIDIDFunc *)in_stack_ffffffffffffea68);
          local_578 = local_4c0;
          compute_tree_depth_order<main::__0>
                    (in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30,
                     (anon_class_8_1_f6d195b4 *)in_stack_ffffffffffffeb28,
                     (int)((ulong)in_stack_ffffffffffffeb20 >> 0x20));
          test_new_elimination_order(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
          ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14e34a);
          ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14e357);
          ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14e364);
          std::__cxx11::string::~string(local_520);
          std::allocator<char>::~allocator((allocator<char> *)&local_521);
        }
        flow_cutter::Config::Config((Config *)local_59c);
        rVar4 = std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
                operator()((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
                           in_stack_ffffffffffffea70);
        local_59c._4_4_ = (undefined4)rVar4;
        local_59c._0_4_ = 0;
        local_57c = max_target_minus_source_hop_dist;
        local_59c._8_4_ = local_4b4;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_600,"random_seed",&local_601);
        flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
        std::operator+((char *)in_stack_ffffffffffffea78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffea70);
        ArrayIDIDFunc::ArrayIDIDFunc
                  (&in_stack_ffffffffffffea70->head,(ArrayIDIDFunc *)in_stack_ffffffffffffea68);
        ArrayIDIDFunc::ArrayIDIDFunc
                  (&in_stack_ffffffffffffea70->head,(ArrayIDIDFunc *)in_stack_ffffffffffffea68);
        local_678 = local_57c;
        pAVar5 = (ArrayIDIDFunc *)CONCAT44(local_59c._4_4_,local_59c._0_4_);
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(local_59c._12_4_,local_59c._8_4_);
        pcStack_688 = (char *)local_59c._16_8_;
        GStack_680 = local_59c._24_4_;
        AStack_67c = local_59c._28_4_;
        config_00.max_cut_size = local_59c._16_4_;
        config_00.min_small_side_size = (float)local_59c._20_4_;
        config_00._0_8_ = pbVar6;
        config_00.skip_non_maximum_sides = local_59c._24_4_;
        config_00.separator_selection = local_59c._28_4_;
        config_00.graph_search_algorithm = local_57c;
        config_00.avoid_augmenting_path = in_stack_ffffffffffffea8c;
        config_00.pierce_rating = in_stack_ffffffffffffea90;
        local_698 = pAVar5;
        pbStack_690 = pbVar6;
        flow_cutter::FastComputeSeparator::FastComputeSeparator
                  ((FastComputeSeparator *)0x14e5fc,config_00);
        compute_tree_depth_order<flow_cutter::FastComputeSeparator>
                  (in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30,
                   (FastComputeSeparator *)in_stack_ffffffffffffeb28,
                   (int)((ulong)in_stack_ffffffffffffeb20 >> 0x20));
        test_new_elimination_order(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
        ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14e653);
        ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14e660);
        ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14e66d);
        std::__cxx11::string::~string(local_5c0);
        std::__cxx11::string::~string(local_5e0);
        std::__cxx11::string::~string(local_600);
        std::allocator<char>::~allocator((allocator<char> *)&local_601);
        flow_cutter::Config::Config((Config *)local_6bc);
        rVar4 = std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
                operator()((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
                           pbVar6);
        local_6bc._4_4_ = (undefined4)rVar4;
        local_6bc._0_4_ = 0;
        local_69c = max_target_minus_source_hop_dist;
        local_6bc._8_4_ = local_4b4;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_720,"random_seed",&local_721);
        flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
        std::operator+((char *)local_59c._16_8_,pbVar6);
        ArrayIDIDFunc::ArrayIDIDFunc((ArrayIDIDFunc *)pbVar6,pAVar5);
        ArrayIDIDFunc::ArrayIDIDFunc((ArrayIDIDFunc *)pbVar6,pAVar5);
        local_798 = local_69c;
        pAVar5 = (ArrayIDIDFunc *)CONCAT44(local_6bc._4_4_,local_6bc._0_4_);
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(local_6bc._12_4_,local_6bc._8_4_);
        pbStack_7a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_6bc._16_8_;
        GStack_7a0 = local_6bc._24_4_;
        AStack_79c = local_6bc._28_4_;
        config_01.max_cut_size = local_6bc._16_4_;
        config_01.min_small_side_size = (float)local_6bc._20_4_;
        config_01._0_8_ = pbVar6;
        config_01.skip_non_maximum_sides = local_6bc._24_4_;
        config_01.separator_selection = local_6bc._28_4_;
        config_01.graph_search_algorithm = local_69c;
        config_01.avoid_augmenting_path = in_stack_ffffffffffffea8c;
        config_01.pierce_rating = in_stack_ffffffffffffea90;
        local_7b8 = pAVar5;
        pbStack_7b0 = pbVar6;
        flow_cutter::ComputeSeparator::ComputeSeparator((ComputeSeparator *)0x14e7e0,config_01);
        compute_tree_depth_order<flow_cutter::ComputeSeparator>
                  (in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
                   (int)((ulong)in_stack_ffffffffffffeb20 >> 0x20));
        test_new_elimination_order(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
        ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14e837);
        ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14e844);
        ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14e851);
        std::__cxx11::string::~string(local_6e0);
        std::__cxx11::string::~string(local_700);
        std::__cxx11::string::~string(local_720);
        std::allocator<char>::~allocator((allocator<char> *)&local_721);
        flow_cutter::Config::Config((Config *)local_7dc);
        local_7dc._8_4_ = local_4b4;
        local_7e0 = 0;
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_6bc._16_8_;
        do {
          iVar2 = (int)((ulong)in_stack_ffffffffffffeb20 >> 0x20);
          if (local_7e0 % 2 == 0) {
            local_7bc = max_target_minus_source_hop_dist;
          }
          else {
            local_7bc = random;
          }
          local_7dc._0_4_ = 1;
          rVar4 = std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
                  operator()((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>
                              *)pbVar6);
          local_7dc._4_4_ = (undefined4)rVar4;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_8c0,"cutter_count",&local_8c1);
          flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
          std::operator+((char *)pbVar7,pbVar6);
          std::operator+(pbVar7,(char *)pbVar6);
          tail = (ArrayIDIDFunc *)local_909;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)(local_909 + 1),"pierce_rating",(allocator *)tail);
          flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
          std::operator+(in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
          std::operator+(pbVar7,(char *)pbVar6);
          head = (ArrayIDIDFunc *)local_951;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)(local_951 + 1),"random_seed",(allocator *)head);
          flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
          std::operator+(in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
          ArrayIDIDFunc::ArrayIDIDFunc((ArrayIDIDFunc *)pbVar6,pAVar5);
          ArrayIDIDFunc::ArrayIDIDFunc((ArrayIDIDFunc *)pbVar6,pAVar5);
          local_9c8 = local_7bc;
          pAVar5 = (ArrayIDIDFunc *)CONCAT44(local_7dc._4_4_,local_7dc._0_4_);
          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(local_7dc._12_4_,local_7dc._8_4_);
          pbStack_9d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_7dc._16_8_;
          GStack_9d0 = local_7dc._24_4_;
          AStack_9cc = local_7dc._28_4_;
          config_02.max_cut_size = local_7dc._16_4_;
          config_02.min_small_side_size = (float)local_7dc._20_4_;
          config_02._0_8_ = pbVar6;
          config_02.skip_non_maximum_sides = local_7dc._24_4_;
          config_02.separator_selection = local_7dc._28_4_;
          config_02.graph_search_algorithm = local_7bc;
          config_02.avoid_augmenting_path = in_stack_ffffffffffffea8c;
          config_02.pierce_rating = in_stack_ffffffffffffea90;
          pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_7dc._16_8_;
          local_9e8 = pAVar5;
          pbStack_9e0 = pbVar6;
          flow_cutter::ComputeSeparator::ComputeSeparator((ComputeSeparator *)0x14ed17,config_02);
          compute_tree_depth_order<flow_cutter::ComputeSeparator>
                    (tail,head,in_stack_ffffffffffffeb28,iVar2);
          test_new_elimination_order(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
          ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14ed6e);
          ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14ed7b);
          ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14ed88);
          std::__cxx11::string::~string(local_800);
          std::__cxx11::string::~string(local_930);
          std::__cxx11::string::~string((string *)(local_951 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_951);
          std::__cxx11::string::~string(local_820);
          std::__cxx11::string::~string(local_840);
          std::__cxx11::string::~string(local_8e8);
          std::__cxx11::string::~string((string *)(local_909 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_909);
          std::__cxx11::string::~string(local_860);
          std::__cxx11::string::~string(local_880);
          std::__cxx11::string::~string(local_8a0);
          std::__cxx11::string::~string(local_8c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
          local_7dc._0_4_ = 2;
          in_stack_ffffffffffffeb28 =
               (ComputeSeparator *)
               std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
               operator()((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
                          pbVar6);
          local_7dc._4_4_ = SUB84(in_stack_ffffffffffffeb28,0);
          in_stack_ffffffffffffeb20 = &local_ac9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_ac8,"cutter_count",in_stack_ffffffffffffeb20);
          flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
          std::operator+((char *)pbVar7,pbVar6);
          std::operator+(pbVar7,(char *)pbVar6);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_b10,"pierce_rating",&local_b11);
          flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
          std::operator+(in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
          std::operator+(pbVar7,(char *)pbVar6);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_b58,"random_seed",&local_b59);
          flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
          std::operator+(in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
          ArrayIDIDFunc::ArrayIDIDFunc((ArrayIDIDFunc *)pbVar6,pAVar5);
          ArrayIDIDFunc::ArrayIDIDFunc((ArrayIDIDFunc *)pbVar6,pAVar5);
          local_bd8 = local_7bc;
          pAVar5 = (ArrayIDIDFunc *)CONCAT44(local_7dc._4_4_,local_7dc._0_4_);
          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(local_7dc._12_4_,local_7dc._8_4_);
          pbStack_be8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_7dc._16_8_;
          GStack_be0 = local_7dc._24_4_;
          AStack_bdc = local_7dc._28_4_;
          config_03.max_cut_size = local_7dc._16_4_;
          config_03.min_small_side_size = (float)local_7dc._20_4_;
          config_03._0_8_ = pbVar6;
          config_03.skip_non_maximum_sides = local_7dc._24_4_;
          config_03.separator_selection = local_7dc._28_4_;
          config_03.graph_search_algorithm = local_7bc;
          config_03.avoid_augmenting_path = in_stack_ffffffffffffea8c;
          config_03.pierce_rating = in_stack_ffffffffffffea90;
          pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_7dc._16_8_;
          local_bf8 = pAVar5;
          pbStack_bf0 = pbVar6;
          flow_cutter::ComputeSeparator::ComputeSeparator((ComputeSeparator *)0x14f073,config_03);
          compute_tree_depth_order<flow_cutter::ComputeSeparator>
                    (tail,head,in_stack_ffffffffffffeb28,
                     (int)((ulong)in_stack_ffffffffffffeb20 >> 0x20));
          test_new_elimination_order(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
          ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14f0ca);
          ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14f0d7);
          ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14f0e4);
          std::__cxx11::string::~string(local_a08);
          std::__cxx11::string::~string(local_b38);
          std::__cxx11::string::~string(local_b58);
          std::allocator<char>::~allocator((allocator<char> *)&local_b59);
          std::__cxx11::string::~string(local_a28);
          std::__cxx11::string::~string(local_a48);
          std::__cxx11::string::~string(local_af0);
          std::__cxx11::string::~string(local_b10);
          std::allocator<char>::~allocator((allocator<char> *)&local_b11);
          std::__cxx11::string::~string(local_a68);
          std::__cxx11::string::~string(local_a88);
          std::__cxx11::string::~string(local_aa8);
          std::__cxx11::string::~string(local_ac8);
          std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
          if (0 < local_7e0 % 3) {
            local_7dc._0_4_ = 3;
            rVar4 = std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
                    operator()((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>
                                *)pbVar6);
            local_7dc._4_4_ = (undefined4)rVar4;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_cd8,"cutter_count",&local_cd9);
            flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
            std::operator+((char *)pbVar7,pbVar6);
            std::operator+(pbVar7,(char *)pbVar6);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_d20,"pierce_rating",&local_d21);
            flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
            std::operator+(in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
            std::operator+(pbVar7,(char *)pbVar6);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_d68,"random_seed",&local_d69);
            flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
            std::operator+(in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
            ArrayIDIDFunc::ArrayIDIDFunc((ArrayIDIDFunc *)pbVar6,pAVar5);
            ArrayIDIDFunc::ArrayIDIDFunc((ArrayIDIDFunc *)pbVar6,pAVar5);
            local_de8 = local_7bc;
            pAVar5 = (ArrayIDIDFunc *)CONCAT44(local_7dc._4_4_,local_7dc._0_4_);
            pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(local_7dc._12_4_,local_7dc._8_4_);
            pbStack_df8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_7dc._16_8_;
            GStack_df0 = local_7dc._24_4_;
            AStack_dec = local_7dc._28_4_;
            config_04.max_cut_size = local_7dc._16_4_;
            config_04.min_small_side_size = (float)local_7dc._20_4_;
            config_04._0_8_ = pbVar6;
            config_04.skip_non_maximum_sides = local_7dc._24_4_;
            config_04.separator_selection = local_7dc._28_4_;
            config_04.graph_search_algorithm = local_7bc;
            config_04.avoid_augmenting_path = in_stack_ffffffffffffea8c;
            config_04.pierce_rating = in_stack_ffffffffffffea90;
            pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_7dc._16_8_;
            local_e08 = pAVar5;
            pbStack_e00 = pbVar6;
            flow_cutter::ComputeSeparator::ComputeSeparator((ComputeSeparator *)0x14f3e7,config_04);
            compute_tree_depth_order<flow_cutter::ComputeSeparator>
                      (tail,head,in_stack_ffffffffffffeb28,
                       (int)((ulong)in_stack_ffffffffffffeb20 >> 0x20));
            test_new_elimination_order(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
            ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14f43e);
            ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14f44b);
            ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14f458);
            std::__cxx11::string::~string(local_c18);
            std::__cxx11::string::~string(local_d48);
            std::__cxx11::string::~string(local_d68);
            std::allocator<char>::~allocator((allocator<char> *)&local_d69);
            std::__cxx11::string::~string(local_c38);
            std::__cxx11::string::~string(local_c58);
            std::__cxx11::string::~string(local_d00);
            std::__cxx11::string::~string(local_d20);
            std::allocator<char>::~allocator((allocator<char> *)&local_d21);
            std::__cxx11::string::~string(local_c78);
            std::__cxx11::string::~string(local_c98);
            std::__cxx11::string::~string(local_cb8);
            std::__cxx11::string::~string(local_cd8);
            std::allocator<char>::~allocator((allocator<char> *)&local_cd9);
          }
          if (0xf < local_7e0 % 0x14) {
            local_7dc._0_4_ = 0x14;
            rVar4 = std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
                    operator()((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>
                                *)pbVar6);
            local_7dc._4_4_ = (undefined4)rVar4;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_ee8,"cutter_count",&local_ee9);
            flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
            std::operator+((char *)pbVar7,pbVar6);
            std::operator+(pbVar7,(char *)pbVar6);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_f30,"pierce_rating",&local_f31);
            flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
            std::operator+(in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
            std::operator+(pbVar7,(char *)pbVar6);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_f78,"random_seed",&local_f79);
            flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
            std::operator+(in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
            ArrayIDIDFunc::ArrayIDIDFunc((ArrayIDIDFunc *)pbVar6,pAVar5);
            ArrayIDIDFunc::ArrayIDIDFunc((ArrayIDIDFunc *)pbVar6,pAVar5);
            local_ff8 = local_7bc;
            pAVar5 = (ArrayIDIDFunc *)CONCAT44(local_7dc._4_4_,local_7dc._0_4_);
            pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(local_7dc._12_4_,local_7dc._8_4_);
            pbStack_1008 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_7dc._16_8_;
            GStack_1000 = local_7dc._24_4_;
            AStack_ffc = local_7dc._28_4_;
            config_05.max_cut_size = local_7dc._16_4_;
            config_05.min_small_side_size = (float)local_7dc._20_4_;
            config_05._0_8_ = pbVar6;
            config_05.skip_non_maximum_sides = local_7dc._24_4_;
            config_05.separator_selection = local_7dc._28_4_;
            config_05.graph_search_algorithm = local_7bc;
            config_05.avoid_augmenting_path = in_stack_ffffffffffffea8c;
            config_05.pierce_rating = in_stack_ffffffffffffea90;
            pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_7dc._16_8_;
            local_1018 = pAVar5;
            pbStack_1010 = pbVar6;
            flow_cutter::ComputeSeparator::ComputeSeparator((ComputeSeparator *)0x14fe2f,config_05);
            compute_tree_depth_order<flow_cutter::ComputeSeparator>
                      (tail,head,in_stack_ffffffffffffeb28,
                       (int)((ulong)in_stack_ffffffffffffeb20 >> 0x20));
            test_new_elimination_order(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
            ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14fe86);
            ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14fe93);
            ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x14fea0);
            std::__cxx11::string::~string(local_e28);
            std::__cxx11::string::~string(local_f58);
            std::__cxx11::string::~string(local_f78);
            std::allocator<char>::~allocator((allocator<char> *)&local_f79);
            std::__cxx11::string::~string(local_e48);
            std::__cxx11::string::~string(local_e68);
            std::__cxx11::string::~string(local_f10);
            std::__cxx11::string::~string(local_f30);
            std::allocator<char>::~allocator((allocator<char> *)&local_f31);
            std::__cxx11::string::~string(local_e88);
            std::__cxx11::string::~string(local_ea8);
            std::__cxx11::string::~string(local_ec8);
            std::__cxx11::string::~string(local_ee8);
            std::allocator<char>::~allocator((allocator<char> *)&local_ee9);
          }
          if (0x1e < local_7e0 % 0x32) {
            local_7dc._0_4_ = 0x28;
            rVar4 = std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
                    operator()((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>
                                *)pbVar6);
            local_7dc._4_4_ = (undefined4)rVar4;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_10f8,"cutter_count",&local_10f9);
            flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
            std::operator+((char *)pbVar7,pbVar6);
            std::operator+(pbVar7,(char *)pbVar6);
            paVar8 = &local_1141;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1140,"pierce_rating",paVar8);
            flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
            std::operator+(in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
            std::operator+(pbVar7,(char *)pbVar6);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1188,"random_seed",&local_1189);
            flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
            std::operator+(in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
            ArrayIDIDFunc::ArrayIDIDFunc((ArrayIDIDFunc *)pbVar6,pAVar5);
            ArrayIDIDFunc::ArrayIDIDFunc((ArrayIDIDFunc *)pbVar6,pAVar5);
            pAVar5 = (ArrayIDIDFunc *)CONCAT44(local_7dc._4_4_,local_7dc._0_4_);
            pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(local_7dc._12_4_,local_7dc._8_4_);
            config_06.max_cut_size = local_7dc._16_4_;
            config_06.min_small_side_size = (float)local_7dc._20_4_;
            config_06._0_8_ = pbVar6;
            config_06.skip_non_maximum_sides = local_7dc._24_4_;
            config_06.separator_selection = local_7dc._28_4_;
            config_06.graph_search_algorithm = local_7bc;
            config_06.avoid_augmenting_path = in_stack_ffffffffffffea8c;
            config_06.pierce_rating = in_stack_ffffffffffffea90;
            pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_7dc._16_8_;
            flow_cutter::ComputeSeparator::ComputeSeparator((ComputeSeparator *)0x1503db,config_06);
            compute_tree_depth_order<flow_cutter::ComputeSeparator>
                      (tail,head,in_stack_ffffffffffffeb28,
                       (int)((ulong)in_stack_ffffffffffffeb20 >> 0x20));
            test_new_elimination_order(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
            ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x150432);
            ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x15043f);
            ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x15044c);
            std::__cxx11::string::~string(local_1038);
            std::__cxx11::string::~string(local_1168);
            std::__cxx11::string::~string(local_1188);
            std::allocator<char>::~allocator((allocator<char> *)&local_1189);
            std::__cxx11::string::~string(local_1058);
            std::__cxx11::string::~string(local_1078);
            std::__cxx11::string::~string(local_1120);
            std::__cxx11::string::~string(local_1140);
            std::allocator<char>::~allocator((allocator<char> *)&local_1141);
            std::__cxx11::string::~string(local_1098);
            std::__cxx11::string::~string(local_10b8);
            std::__cxx11::string::~string(local_10d8);
            std::__cxx11::string::~string(local_10f8);
            std::allocator<char>::~allocator((allocator<char> *)&local_10f9);
          }
          if (0x62 < local_7e0 % 100) {
            local_7dc._0_4_ = 0x50;
            in_stack_ffffffffffffeaa8 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
                 operator()((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *
                            )pbVar6);
            local_7dc._4_4_ = SUB84(in_stack_ffffffffffffeaa8,0);
            in_stack_ffffffffffffeaa0 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1309;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_1309 + 1),"cutter_count",
                       (allocator *)in_stack_ffffffffffffeaa0);
            flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
            std::operator+((char *)pbVar7,pbVar6);
            std::operator+(pbVar7,(char *)pbVar6);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1350,"pierce_rating",&local_1351);
            flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
            std::operator+(in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
            std::operator+(pbVar7,(char *)pbVar6);
            in_stack_ffffffffffffea90 = (PierceRating)&local_1399;
            uStack_156c = (undefined4)((ulong)&local_1399 >> 0x20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_1398,"random_seed",
                       (allocator *)CONCAT44(uStack_156c,in_stack_ffffffffffffea90));
            flow_cutter::Config::get((Config *)this,in_stack_ffffffffffffebb0);
            std::operator+(in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
            ArrayIDIDFunc::ArrayIDIDFunc((ArrayIDIDFunc *)pbVar6,pAVar5);
            ArrayIDIDFunc::ArrayIDIDFunc((ArrayIDIDFunc *)pbVar6,pAVar5);
            pAVar5 = (ArrayIDIDFunc *)CONCAT44(local_7dc._4_4_,local_7dc._0_4_);
            pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(local_7dc._12_4_,local_7dc._8_4_);
            config_07.max_cut_size = local_7dc._16_4_;
            config_07.min_small_side_size = (float)local_7dc._20_4_;
            config_07._0_8_ = pbVar6;
            config_07.skip_non_maximum_sides = local_7dc._24_4_;
            config_07.separator_selection = local_7dc._28_4_;
            config_07.graph_search_algorithm = local_7bc;
            config_07.avoid_augmenting_path = in_stack_ffffffffffffea8c;
            config_07.pierce_rating = in_stack_ffffffffffffea90;
            pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_7dc._16_8_;
            flow_cutter::ComputeSeparator::ComputeSeparator((ComputeSeparator *)0x150987,config_07);
            compute_tree_depth_order<flow_cutter::ComputeSeparator>
                      (tail,head,in_stack_ffffffffffffeb28,
                       (int)((ulong)in_stack_ffffffffffffeb20 >> 0x20));
            test_new_elimination_order(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
            ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x1509de);
            ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x1509eb);
            ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x1509f8);
            std::__cxx11::string::~string((string *)&stack0xffffffffffffedb8);
            std::__cxx11::string::~string(local_1378);
            std::__cxx11::string::~string(local_1398);
            std::allocator<char>::~allocator(&local_1399);
            std::__cxx11::string::~string(local_1268);
            std::__cxx11::string::~string(local_1288);
            std::__cxx11::string::~string(local_1330);
            std::__cxx11::string::~string(local_1350);
            std::allocator<char>::~allocator((allocator<char> *)&local_1351);
            std::__cxx11::string::~string(local_12a8);
            std::__cxx11::string::~string(local_12c8);
            std::__cxx11::string::~string(local_12e8);
            std::__cxx11::string::~string((string *)(local_1309 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_1309);
          }
          local_7e0 = local_7e0 + 1;
        } while( true );
      }
      return local_4;
    }
    iVar1 = strcmp(*(char **)(local_10 + (long)local_50 * 8),"--help");
    iVar2 = (int)((ulong)in_stack_ffffffffffffeab8 >> 0x20);
    if (iVar1 == 0) {
LAB_0014dc76:
      memcpy(local_3b8,
             "Computes a tree depth decomposition given a graph. The graph is read by default from stdin in the PACE 2020 graph format. The output is written to stdout. Status messages can be written to stderr, if requested. By default, nothing is written to stderr. The program supports the following options:\n  -h,--help Print this message and do nothing else\n  --status  Print a message to stderr each time a\n            better tree depth decomposition is found\n  --verbose Print a message to stderr each time a tree\n            depth decomposition was computed independent\n            of whether it is better than the best one \n            found so far\n  -i <file> Instead of reading the graph from stdin,\n            read it from <file>\n  -s <seed> Use <seed> as seed for the random number\n            generator. This must be an integer. The\n            default seed is 0.\n"
             ,0x361);
      in_stack_ffffffffffffebb0 = (string *)write(2,local_3b8,0x360);
      ignore_return_value((int)in_stack_ffffffffffffebb0);
      local_4 = 1;
      local_3bc = 1;
      goto LAB_0014deec;
    }
    iVar1 = strcmp(*(char **)(local_10 + (long)local_50 * 8),"-h");
    iVar2 = (int)((ulong)in_stack_ffffffffffffeab8 >> 0x20);
    if (iVar1 == 0) goto LAB_0014dc76;
    iVar2 = strcmp(*(char **)(local_10 + (long)local_50 * 8),"--verbose");
    if (iVar2 == 0) {
      print_verbose_status = true;
      print_status = true;
    }
    else {
      iVar2 = strcmp(*(char **)(local_10 + (long)local_50 * 8),"--status");
      if (iVar2 == 0) {
        print_status = true;
      }
      else {
        iVar2 = strcmp(*(char **)(local_10 + (long)local_50 * 8),"-i");
        if ((iVar2 == 0) && (local_50 != local_8 + -1)) {
          local_50 = local_50 + 1;
          std::__cxx11::string::operator=(local_38,*(char **)(local_10 + (long)local_50 * 8));
        }
        else {
          iVar2 = strcmp(*(char **)(local_10 + (long)local_50 * 8),"-s");
          if ((iVar2 == 0) && (local_50 != local_8 + -1)) {
            local_50 = local_50 + 1;
            local_14 = atoi(*(char **)(local_10 + (long)local_50 * 8));
          }
        }
      }
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
    signal(SIGTERM, signal_handler);
    signal(SIGINT, signal_handler);
    signal(SIGSEGV, signal_handler);

    int random_seed = 0;

    try {
        {
            string input_file_name = "-";
            for (int i = 1; i < argc; ++i) {
                if (!strcmp(argv[i], "--help") || !strcmp(argv[i], "-h")){
                    char msg[] = "Computes a tree depth decomposition given a graph. The graph is read by default from stdin in the PACE 2020 graph format. The output is written to stdout. Status messages can be written to stderr, if requested. By default, nothing is written to stderr. The program supports the following options:\n"
                    "  -h,--help Print this message and do nothing else\n"
                    "  --status  Print a message to stderr each time a\n"
                    "            better tree depth decomposition is found\n"
                    "  --verbose Print a message to stderr each time a tree\n"
                    "            depth decomposition was computed independent\n"
                    "            of whether it is better than the best one \n"
                    "            found so far\n"
                    "  -i <file> Instead of reading the graph from stdin,\n"
                    "            read it from <file>\n"
                    "  -s <seed> Use <seed> as seed for the random number\n"
                    "            generator. This must be an integer. The\n"
                    "            default seed is 0.\n";
                    ignore_return_value(write(STDERR_FILENO, msg, sizeof(msg)-1));
                    return 1;
                } else if (!strcmp(argv[i], "--verbose")) {
                    print_verbose_status = true;
                    print_status = true;
                } else if (!strcmp(argv[i], "--status")) {
                    print_status = true;
                } else if (!strcmp(argv[i], "-i") && i != argc - 1) {
                    ++i;
                    input_file_name = argv[i];
                } else if (!strcmp(argv[i], "-s") && i != argc - 1) {
                    ++i;
                    random_seed = atoi(argv[i]);
                }
            }

            auto g = uncached_load_pace_graph(input_file_name);
            tail = std::move(g.tail);
            head = std::move(g.head);
        }

        if (print_status) {
            string msg = "node_count = " + to_string(tail.image_count()) + " arc_count = " + to_string(tail.preimage_count()) + "\n";
            ignore_return_value(write(STDERR_FILENO, msg.data(), msg.length()));
        }

        if (print_status)
            program_start_milli_time = get_milli_time();

        const int node_count = tail.image_count();
                        
        #ifdef PARALLELIZE
        #pragma omp parallel
        #endif
        {
            try {
                std::minstd_rand rand_gen;
                rand_gen.seed(random_seed
                    #ifdef PARALLELIZE
                    + omp_get_thread_num()
                    #endif
                );

                #ifdef PARALLELIZE
                #pragma omp sections nowait
                #endif
                {
                    #ifdef PARALLELIZE
                    #pragma omp section
                    #endif
                    {
                        test_new_elimination_order("greedy order", compute_greedy_order(tail, head));

                        if(20*best_tree_depth > node_count)
                            test_new_elimination_order("refined bfs split in nested dissection", compute_tree_depth_order(
                                tail, head, 
                                [&](const ArrayIDIDFunc& tail, const ArrayIDIDFunc& head, int max_size) {
                                    return compute_separator_by_running_bfs(tail, head, max_size, rand_gen);
                                },
                                best_tree_depth - 1)
                            );
                    }

                    #ifdef PARALLELIZE
                    #pragma omp section
                    #endif
                    {
                        flow_cutter::Config config;
                        config.random_seed = rand_gen();
                        config.cutter_count = 0;
                        config.pierce_rating = flow_cutter::Config::PierceRating::max_target_minus_source_hop_dist;
                        config.max_cut_size = node_count;
                        test_new_elimination_order(
                            "edge flowcutter cutter_count=1 distant-source-target pierce_rating=max_target_minus_source_hop_dist random_seed=" + config.get("random_seed"),
                            compute_tree_depth_order(
                                tail, head,
                                flow_cutter::FastComputeSeparator(config),
                                best_tree_depth - 1));
                    }
                    #ifdef PARALLELIZE
                    #pragma omp section
                    #endif
                    { 
                        flow_cutter::Config config;
                        config.random_seed = rand_gen();
                        config.cutter_count = 0;
                        config.pierce_rating = flow_cutter::Config::PierceRating::max_target_minus_source_hop_dist;
                        config.max_cut_size = node_count;
                        test_new_elimination_order(
                            "flowcutter cutter_count=1 distant-source-target pierce_rating=max_target_minus_source_hop_dist random_seed=" + config.get("random_seed"),
                            compute_tree_depth_order(
                                tail, head,
                                flow_cutter::ComputeSeparator(config),
                                best_tree_depth - 1)
                        );
                    }
                }

                {
                    flow_cutter::Config config;
                    config.max_cut_size = node_count;

                    for (int i = 0;; ++i) {
                        
                        if (i % 2 == 0) {
                            config.pierce_rating = flow_cutter::Config::PierceRating::
                                max_target_minus_source_hop_dist;
                        } else {
                            config.pierce_rating = flow_cutter::Config::PierceRating::random;
                        }
                        
                        config.cutter_count = 1;
                        config.random_seed = rand_gen();
                        test_new_elimination_order(
                            "flowcutter"
                            " cutter_count="
                                + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                            compute_tree_depth_order(
                                tail, head,
                                flow_cutter::ComputeSeparator(config),
                                best_tree_depth - 1));


                        config.cutter_count = 2;
                        config.random_seed = rand_gen();
                        test_new_elimination_order(
                            "flowcutter"
                            " cutter_count="
                                + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                            compute_tree_depth_order(
                                tail, head,
                                flow_cutter::ComputeSeparator(config),
                                best_tree_depth - 1));

                        if((i%3)>0){
                                config.cutter_count = 3;
                                config.random_seed = rand_gen();
                                test_new_elimination_order(
                                    "flowcutter"
                                    " cutter_count="
                                        + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                                    compute_tree_depth_order(
                                        tail, head,
                                        flow_cutter::ComputeSeparator(config),
                                        best_tree_depth - 1));
                        }

                        if((i%20)>15){
                                config.cutter_count = 20;
                                config.random_seed = rand_gen();
                                test_new_elimination_order(
                                    "flowcutter"
                                    " cutter_count="
                                        + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                                    compute_tree_depth_order(
                                        tail, head,
                                        flow_cutter::ComputeSeparator(config),
                                        best_tree_depth - 1));
                        }

                        if((i%50)>30){
                                config.cutter_count = 40;
                                config.random_seed = rand_gen();
                                test_new_elimination_order(
                                    "flowcutter"
                                    " cutter_count="
                                        + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                                    compute_tree_depth_order(
                                        tail, head,
                                        flow_cutter::ComputeSeparator(config),
                                        best_tree_depth - 1));
                        }

                        if((i%100)>98){
                                config.cutter_count = 80;
                                config.random_seed = rand_gen();
                                test_new_elimination_order(
                                    "flowcutter"
                                    " cutter_count="
                                        + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                                    compute_tree_depth_order(
                                        tail, head,
                                        flow_cutter::ComputeSeparator(config),
                                        best_tree_depth - 1));
                        }
                    }
                }
            }
            catch (...)
            {
                signal_handler(0);
            }
        }
    }
    catch (...)
    {
        signal_handler(0);
    }
}